

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O0

void __thiscall test_app::test_objects(test_app *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  cache_interface *pcVar4;
  string *psVar5;
  size_type sVar6;
  runtime_error *prVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  ostringstream oss_51;
  ostringstream oss_50;
  ostringstream oss_49;
  ostringstream oss_48;
  string t2_2;
  string t1_2;
  mydata d2_2;
  mydata d1_2;
  ostringstream oss_47;
  ostringstream oss_46;
  ostringstream oss_45;
  ostringstream oss_44;
  ostringstream oss_43;
  ostringstream oss_42;
  ostringstream oss_41;
  ostringstream oss_40;
  string t2_1;
  string t1_1;
  mydata d2_1;
  mydata d1_1;
  mydata d2;
  mydata d1;
  ostringstream oss_39;
  ostringstream oss_38;
  ostringstream oss_37;
  ostringstream oss_36;
  ostringstream oss_35;
  string tmp_5;
  mydata d_9;
  triggers_recorder tr_9;
  ostringstream oss_34;
  mydata d_8;
  triggers_recorder tr_8;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  ostringstream oss_29;
  string tmp_4;
  mydata d_7;
  triggers_recorder tr_7;
  ostringstream oss_28;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  ostringstream oss_24;
  string tmp_3;
  mydata d_6;
  triggers_recorder tr_6;
  ostringstream oss_23;
  mydata d_5;
  triggers_recorder tr_5;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tg_1;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  string tmp_2;
  mydata d_4;
  triggers_recorder tr_4;
  ostringstream oss_15;
  mydata d_3;
  triggers_recorder tr_3;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  string tmp_1;
  mydata d_2;
  triggers_recorder tr_2;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tg;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  string tmp;
  mydata d_1;
  triggers_recorder tr_1;
  ostringstream oss;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t1;
  mydata d;
  triggers_recorder tr;
  char *in_stack_ffffffffffff8ff8;
  mydata *in_stack_ffffffffffff9000;
  key_type *in_stack_ffffffffffff9008;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffff9010;
  value_type *in_stack_ffffffffffff9018;
  undefined6 in_stack_ffffffffffff9020;
  undefined1 in_stack_ffffffffffff9026;
  undefined1 in_stack_ffffffffffff9027;
  undefined8 in_stack_ffffffffffff9030;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffff9038;
  mydata *in_stack_ffffffffffff9040;
  mydata *in_stack_ffffffffffff9048;
  string *in_stack_ffffffffffff9050;
  cache_interface *in_stack_ffffffffffff9058;
  undefined6 in_stack_ffffffffffff9060;
  undefined1 in_stack_ffffffffffff9066;
  undefined1 in_stack_ffffffffffff9067;
  string *in_stack_ffffffffffff9068;
  allocator *paVar9;
  cache_interface *in_stack_ffffffffffff9070;
  undefined8 in_stack_ffffffffffff9208;
  undefined1 uVar10;
  test_app *in_stack_ffffffffffff9210;
  string local_63b8 [32];
  ostringstream local_6398 [383];
  allocator local_6219;
  string local_6218 [39];
  undefined1 local_61f1;
  string local_61f0 [32];
  ostringstream local_61d0 [383];
  allocator local_6051;
  string local_6050 [39];
  undefined1 local_6029;
  string local_6028 [32];
  ostringstream local_6008 [383];
  allocator local_5e89;
  string local_5e88 [39];
  undefined1 local_5e61;
  string local_5e60 [32];
  ostringstream local_5e40 [383];
  allocator local_5cc1;
  string local_5cc0 [32];
  string local_5ca0 [32];
  string local_5c80 [71];
  undefined1 local_5c39;
  string local_5c38 [32];
  ostringstream local_5c18 [383];
  undefined1 local_5a99;
  string local_5a98 [32];
  ostringstream local_5a78 [383];
  undefined1 local_58f9;
  string local_58f8 [32];
  ostringstream local_58d8 [383];
  undefined1 local_5759;
  string local_5758 [32];
  ostringstream local_5738 [383];
  undefined1 local_55b9;
  string local_55b8 [32];
  ostringstream local_5598 [383];
  allocator local_5419;
  string local_5418 [39];
  undefined1 local_53f1;
  string local_53f0 [32];
  ostringstream local_53d0 [383];
  allocator local_5251;
  string local_5250 [39];
  undefined1 local_5229;
  string local_5228 [32];
  ostringstream local_5208 [383];
  allocator local_5089;
  string local_5088 [39];
  undefined1 local_5061;
  string local_5060 [32];
  ostringstream local_5040 [383];
  allocator local_4ec1;
  string local_4ec0 [32];
  string local_4ea0 [32];
  string local_4e80 [40];
  int local_4e58;
  int local_4e54;
  int local_4e48;
  int local_4e44;
  allocator local_4e39;
  string local_4e38 [39];
  allocator local_4e11;
  string local_4e10 [39];
  allocator local_4de9;
  string local_4de8 [32];
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined8 local_4db8;
  undefined8 uStack_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  allocator local_4d89;
  string local_4d88 [32];
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  undefined8 local_4d48;
  undefined8 uStack_4d40;
  allocator local_4d29;
  string local_4d28 [39];
  allocator local_4d01;
  string local_4d00 [71];
  undefined1 local_4cb9;
  string local_4cb8 [32];
  ostringstream local_4c98 [431];
  undefined1 local_4ae9;
  string local_4ae8 [32];
  ostringstream local_4ac8 [383];
  undefined1 local_4949;
  string local_4948 [32];
  ostringstream local_4928 [383];
  undefined1 local_47a9;
  string local_47a8 [32];
  ostringstream local_4788 [383];
  allocator local_4609;
  string local_4608 [39];
  undefined1 local_45e1;
  string local_45e0 [32];
  ostringstream local_45c0 [383];
  allocator local_4441;
  string local_4440 [32];
  string local_4420 [40];
  int local_43f8;
  int local_43f4;
  triggers_recorder local_43f0 [71];
  undefined1 local_43a9;
  string local_43a8 [32];
  ostringstream local_4388 [431];
  allocator local_41d9;
  string local_41d8 [39];
  allocator local_41b1;
  string local_41b0 [39];
  allocator local_4189;
  string local_4188 [48];
  triggers_recorder local_4158 [71];
  undefined1 local_4111;
  string local_4110 [32];
  ostringstream local_40f0 [431];
  undefined1 local_3f41;
  string local_3f40 [32];
  ostringstream local_3f20 [383];
  undefined1 local_3da1;
  string local_3da0 [32];
  ostringstream local_3d80 [383];
  undefined1 local_3c01;
  string local_3c00 [32];
  ostringstream local_3be0 [383];
  allocator local_3a61;
  string local_3a60 [39];
  undefined1 local_3a39;
  string local_3a38 [32];
  ostringstream local_3a18 [383];
  allocator local_3899;
  string local_3898 [32];
  string local_3878 [40];
  int local_3850;
  int local_384c;
  triggers_recorder local_3848 [71];
  undefined1 local_3801;
  string local_3800 [32];
  ostringstream local_37e0 [431];
  undefined1 local_3631;
  string local_3630 [32];
  ostringstream local_3610 [383];
  undefined1 local_3491;
  string local_3490 [32];
  ostringstream local_3470 [383];
  undefined1 local_32f1;
  string local_32f0 [32];
  ostringstream local_32d0 [383];
  allocator local_3151;
  string local_3150 [39];
  undefined1 local_3129;
  string local_3128 [32];
  ostringstream local_3108 [383];
  allocator local_2f89;
  string local_2f88 [32];
  string local_2f68 [40];
  int local_2f40;
  int local_2f3c;
  triggers_recorder local_2f38 [71];
  undefined1 local_2ef1;
  string local_2ef0 [32];
  ostringstream local_2ed0 [424];
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  allocator local_2ce9;
  string local_2ce8 [32];
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 local_2ca8;
  undefined8 uStack_2ca0;
  allocator local_2c91;
  string local_2c90 [39];
  allocator local_2c69;
  string local_2c68 [48];
  triggers_recorder local_2c38 [71];
  undefined1 local_2bf1;
  string local_2bf0 [32];
  ostringstream local_2bd0 [383];
  allocator local_2a51;
  string local_2a50 [39];
  undefined1 local_2a29;
  string local_2a28 [32];
  ostringstream local_2a08 [383];
  allocator local_2889;
  string local_2888 [39];
  undefined1 local_2861;
  string local_2860 [32];
  ostringstream local_2840 [431];
  undefined1 local_2691;
  string local_2690 [32];
  ostringstream local_2670 [383];
  undefined1 local_24f1;
  string local_24f0 [32];
  ostringstream local_24d0 [383];
  undefined1 local_2351;
  string local_2350 [32];
  ostringstream local_2330 [383];
  allocator local_21b1;
  string local_21b0 [39];
  undefined1 local_2189;
  string local_2188 [32];
  ostringstream local_2168 [383];
  allocator local_1fe9;
  string local_1fe8 [32];
  string local_1fc8 [40];
  int local_1fa0;
  int local_1f9c;
  triggers_recorder local_1f98 [71];
  undefined1 local_1f51;
  string local_1f50 [32];
  ostringstream local_1f30 [431];
  allocator local_1d81;
  string local_1d80 [39];
  allocator local_1d59;
  string local_1d58 [39];
  allocator local_1d31;
  string local_1d30 [48];
  triggers_recorder local_1d00 [71];
  undefined1 local_1cb9;
  string local_1cb8 [32];
  ostringstream local_1c98 [431];
  undefined1 local_1ae9;
  string local_1ae8 [32];
  ostringstream local_1ac8 [383];
  undefined1 local_1949;
  string local_1948 [32];
  ostringstream local_1928 [383];
  undefined1 local_17a9;
  string local_17a8 [32];
  ostringstream local_1788 [383];
  allocator local_1609;
  string local_1608 [39];
  undefined1 local_15e1;
  string local_15e0 [32];
  ostringstream local_15c0 [383];
  allocator local_1441;
  string local_1440 [32];
  string local_1420 [40];
  int local_13f8;
  int local_13f4;
  triggers_recorder local_13f0 [71];
  undefined1 local_13a9;
  string local_13a8 [32];
  ostringstream local_1388 [383];
  allocator local_1209;
  string local_1208 [39];
  undefined1 local_11e1;
  string local_11e0 [32];
  ostringstream local_11c0 [383];
  allocator local_1041;
  string local_1040 [39];
  undefined1 local_1019;
  string local_1018 [32];
  ostringstream local_ff8 [383];
  allocator local_e79;
  string local_e78 [39];
  undefined1 local_e51;
  string local_e50 [32];
  ostringstream local_e30 [383];
  allocator local_cb1;
  string local_cb0 [39];
  undefined1 local_c89;
  string local_c88 [32];
  ostringstream local_c68 [431];
  undefined1 local_ab9;
  string local_ab8 [32];
  ostringstream local_a98 [383];
  undefined1 local_919;
  string local_918 [32];
  ostringstream local_8f8 [383];
  undefined1 local_779;
  string local_778 [32];
  ostringstream local_758 [383];
  allocator local_5d9;
  string local_5d8 [39];
  undefined1 local_5b1;
  string local_5b0 [32];
  ostringstream local_590 [383];
  allocator local_411;
  string local_410 [32];
  string local_3f0 [40];
  int local_3c8;
  int local_3c4;
  triggers_recorder local_3c0 [71];
  undefined1 local_379;
  string local_378 [32];
  ostringstream local_358 [431];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  allocator local_121;
  string local_120 [32];
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator local_e9;
  string local_e8 [80];
  undefined1 local_98 [80];
  triggers_recorder local_48 [72];
  
  uVar10 = (undefined1)((ulong)in_stack_ffffffffffff9208 >> 0x38);
  poVar3 = std::operator<<((ostream *)&std::cout,"- Data Object");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  set_context(in_stack_ffffffffffff9210,(bool)uVar10);
  poVar3 = std::operator<<((ostream *)&std::cout,"-- With Triggers Full API");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_48,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x11c2fc);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x11c309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"k1",&local_e9);
  pVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffff9027,
                               CONCAT16(in_stack_ffffffffffff9026,in_stack_ffffffffffff9020)),
                   in_stack_ffffffffffff9018);
  local_100 = (_Base_ptr)pVar8.first._M_node;
  local_f8 = pVar8.second;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"k2",&local_121);
  pVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffff9027,
                               CONCAT16(in_stack_ffffffffffff9026,in_stack_ffffffffffff9020)),
                   in_stack_ffffffffffff9018);
  local_138 = (_Base_ptr)pVar8.first._M_node;
  local_130 = pVar8.second;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"foo",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"bar",&local_181);
  cppcms::cache_interface::store_frame(psVar5,local_158,(set *)local_180,(int)local_98,true);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"dat",&local_1a9);
  cppcms::cache_interface::store_data<mydata>
            ((cache_interface *)in_stack_ffffffffffff9050,(string *)in_stack_ffffffffffff9048,
             in_stack_ffffffffffff9040,in_stack_ffffffffffff9038,
             (int)((ulong)in_stack_ffffffffffff9030 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffff9030 >> 0x18,0));
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11c5c4);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11c5d9);
  if (sVar6 != 4) {
    std::__cxx11::ostringstream::ostringstream(local_358);
    poVar3 = std::operator<<((ostream *)local_358,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xaf);
    std::operator<<(poVar3," tr.detach().size()==4");
    local_379 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_378);
    local_379 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11c908);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11c915);
  mydata::~mydata((mydata *)0x11c922);
  cppcms::triggers_recorder::~triggers_recorder(local_48);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_3c0,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_3f0);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"foo",&local_411);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_410,SUB81(local_3f0,0));
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_590);
    poVar3 = std::operator<<((ostream *)local_590,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb6);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp)");
    local_5b1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_5b0);
    local_5b1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"dat",&local_5d9);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_758);
    poVar3 = std::operator<<((ostream *)local_758,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb7);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d)");
    local_779 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_778);
    local_779 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_3c8 != 1) || (local_3c4 != 2)) {
    std::__cxx11::ostringstream::ostringstream(local_8f8);
    poVar3 = std::operator<<((ostream *)local_8f8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb8);
    std::operator<<(poVar3," d.x==1 && d.y==2");
    local_919 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_918);
    local_919 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_a98);
    poVar3 = std::operator<<((ostream *)local_a98,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb9);
    std::operator<<(poVar3," tmp==\"bar\"");
    local_ab9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_ab8);
    local_ab9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11d245);
  if (sVar6 != 4) {
    std::__cxx11::ostringstream::ostringstream(local_c68);
    poVar3 = std::operator<<((ostream *)local_c68,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbb);
    std::operator<<(poVar3," tg.size()==4");
    local_c89 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_c88);
    local_c89 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb0,"foo",&local_cb1);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_e30);
    poVar3 = std::operator<<((ostream *)local_e30,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbc);
    std::operator<<(poVar3," tg.count(\"foo\")==1");
    local_e51 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_e50);
    local_e51 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e78,"dat",&local_e79);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_ff8);
    poVar3 = std::operator<<((ostream *)local_ff8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbd);
    std::operator<<(poVar3," tg.count(\"dat\")==1");
    local_1019 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1018);
    local_1019 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1040,"k1",&local_1041);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_11c0);
    poVar3 = std::operator<<((ostream *)local_11c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbe);
    std::operator<<(poVar3," tg.count(\"k1\")==1");
    local_11e1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_11e0);
    local_11e1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1208,"k2",&local_1209);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_1388);
    poVar3 = std::operator<<((ostream *)local_1388,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbf);
    std::operator<<(poVar3," tg.count(\"k2\")==1");
    local_13a9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_13a8);
    local_13a9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11dd37);
  std::__cxx11::string::~string(local_3f0);
  mydata::~mydata((mydata *)0x11dd51);
  cppcms::triggers_recorder::~triggers_recorder(local_3c0);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_13f0,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_1420);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1440,"foo",&local_1441);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_1440,SUB81(local_1420,0));
  std::__cxx11::string::~string(local_1440);
  std::allocator<char>::~allocator((allocator<char> *)&local_1441);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_15c0);
    poVar3 = std::operator<<((ostream *)local_15c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc6);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp,true)");
    local_15e1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_15e0);
    local_15e1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1608,"dat",&local_1609);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_1608);
  std::allocator<char>::~allocator((allocator<char> *)&local_1609);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1788);
    poVar3 = std::operator<<((ostream *)local_1788,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,199);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d,true)");
    local_17a9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_17a8);
    local_17a9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_13f8 != 1) || (local_13f4 != 2)) {
    std::__cxx11::ostringstream::ostringstream(local_1928);
    poVar3 = std::operator<<((ostream *)local_1928,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,200);
    std::operator<<(poVar3," d.x==1 && d.y==2");
    local_1949 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1948);
    local_1949 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1ac8);
    poVar3 = std::operator<<((ostream *)local_1ac8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc9);
    std::operator<<(poVar3," tmp==\"bar\"");
    local_1ae9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1ae8);
    local_1ae9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11e67a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11e68f);
  if (sVar6 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1c98);
    poVar3 = std::operator<<((ostream *)local_1c98,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xca);
    std::operator<<(poVar3," tr.detach().size()==0");
    local_1cb9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1cb8);
    local_1cb9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_1420);
  mydata::~mydata((mydata *)0x11e841);
  cppcms::triggers_recorder::~triggers_recorder(local_13f0);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_1d00,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d30,"foo",&local_1d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d58,"baz",&local_1d59);
  cppcms::cache_interface::store_frame(psVar5,local_1d30,(int)local_1d58,true);
  std::__cxx11::string::~string(local_1d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d59);
  std::__cxx11::string::~string(local_1d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d31);
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d80,"dat",&local_1d81);
  cppcms::cache_interface::store_data<mydata>
            (in_stack_ffffffffffff9070,in_stack_ffffffffffff9068,
             (mydata *)
             CONCAT17(in_stack_ffffffffffff9067,
                      CONCAT16(in_stack_ffffffffffff9066,in_stack_ffffffffffff9060)),
             (int)((ulong)in_stack_ffffffffffff9058 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffff9058 >> 0x18,0));
  std::__cxx11::string::~string(local_1d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d81);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11ea20);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11ea35);
  if (sVar6 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_1f30);
    poVar3 = std::operator<<((ostream *)local_1f30,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd2);
    std::operator<<(poVar3," tr.detach().size()==2");
    local_1f51 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1f50);
    local_1f51 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  mydata::~mydata((mydata *)0x11ecfe);
  cppcms::triggers_recorder::~triggers_recorder(local_1d00);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_1f98,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_1fc8);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fe8,"foo",&local_1fe9);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_1fe8,SUB81(local_1fc8,0));
  std::__cxx11::string::~string(local_1fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2168);
    poVar3 = std::operator<<((ostream *)local_2168,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd9);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp)");
    local_2189 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2188);
    local_2189 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_21b0,"dat",&local_21b1);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_21b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b1);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2330);
    poVar3 = std::operator<<((ostream *)local_2330,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xda);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d)");
    local_2351 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2350);
    local_2351 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_1fa0 != 4) || (local_1f9c != 5)) {
    std::__cxx11::ostringstream::ostringstream(local_24d0);
    poVar3 = std::operator<<((ostream *)local_24d0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdb);
    std::operator<<(poVar3," d.x==4 && d.y==5");
    local_24f1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_24f0);
    local_24f1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2670);
    poVar3 = std::operator<<((ostream *)local_2670,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdc);
    std::operator<<(poVar3," tmp==\"baz\"");
    local_2691 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2690);
    local_2691 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11f607);
  if (sVar6 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_2840);
    poVar3 = std::operator<<((ostream *)local_2840,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xde);
    std::operator<<(poVar3," tg.size()==2");
    local_2861 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2860);
    local_2861 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2888,"foo",&local_2889);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_2888);
  std::allocator<char>::~allocator((allocator<char> *)&local_2889);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2a08);
    poVar3 = std::operator<<((ostream *)local_2a08,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdf);
    std::operator<<(poVar3," tg.count(\"foo\")==1");
    local_2a29 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2a28);
    local_2a29 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a50,"dat",&local_2a51);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffff9010,in_stack_ffffffffffff9008);
  std::__cxx11::string::~string(local_2a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a51);
  if (sVar6 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2bd0);
    poVar3 = std::operator<<((ostream *)local_2bd0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe0);
    std::operator<<(poVar3," tg.count(\"dat\")==1");
    local_2bf1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2bf0);
    local_2bf1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11fc5b);
  std::__cxx11::string::~string(local_1fc8);
  mydata::~mydata((mydata *)0x11fc75);
  cppcms::triggers_recorder::~triggers_recorder(local_1f98);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  poVar3 = std::operator<<((ostream *)&std::cout,"-- Without Triggers");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_2c38,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c68,"foo",&local_2c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c90,"bar",&local_2c91);
  local_2ca8 = 0;
  uStack_2ca0 = 0;
  local_2cb8 = 0;
  uStack_2cb0 = 0;
  local_2cc8 = 0;
  uStack_2cc0 = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x11fdb1);
  cppcms::cache_interface::store_frame(psVar5,local_2c68,(set *)local_2c90,(int)&local_2cc8,true);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11fdf1);
  std::__cxx11::string::~string(local_2c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c91);
  std::__cxx11::string::~string(local_2c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c69);
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ce8,"dat",&local_2ce9);
  local_2d08 = 0;
  uStack_2d00 = 0;
  local_2d18 = 0;
  uStack_2d10 = 0;
  local_2d28 = 0;
  uStack_2d20 = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x11fe9f);
  cppcms::cache_interface::store_data<mydata>
            ((cache_interface *)in_stack_ffffffffffff9050,(string *)in_stack_ffffffffffff9048,
             in_stack_ffffffffffff9040,in_stack_ffffffffffff9038,
             (int)((ulong)in_stack_ffffffffffff9030 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffff9030 >> 0x18,0));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11fedf);
  std::__cxx11::string::~string(local_2ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ce9);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x11ff1d);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11ff32);
  if (sVar6 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_2ed0);
    poVar3 = std::operator<<((ostream *)local_2ed0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xec);
    std::operator<<(poVar3," tr.detach().size()==0");
    local_2ef1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2ef0);
    local_2ef1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  mydata::~mydata((mydata *)0x120222);
  cppcms::triggers_recorder::~triggers_recorder(local_2c38);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_2f38,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_2f68);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f88,"foo",&local_2f89);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_2f88,SUB81(local_2f68,0));
  std::__cxx11::string::~string(local_2f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f89);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_3108);
    poVar3 = std::operator<<((ostream *)local_3108,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf3);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp,true)");
    local_3129 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3128);
    local_3129 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3150,"dat",&local_3151);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_3150);
  std::allocator<char>::~allocator((allocator<char> *)&local_3151);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_32d0);
    poVar3 = std::operator<<((ostream *)local_32d0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf4);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d,true)");
    local_32f1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_32f0);
    local_32f1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_2f40 != 1) || (local_2f3c != 2)) {
    std::__cxx11::ostringstream::ostringstream(local_3470);
    poVar3 = std::operator<<((ostream *)local_3470,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf5);
    std::operator<<(poVar3," d.x==1 && d.y==2");
    local_3491 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3490);
    local_3491 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3610);
    poVar3 = std::operator<<((ostream *)local_3610,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf6);
    std::operator<<(poVar3," tmp==\"bar\"");
    local_3631 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3630);
    local_3631 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x120b31);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x120b46);
  if (sVar6 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_37e0);
    poVar3 = std::operator<<((ostream *)local_37e0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf7);
    std::operator<<(poVar3," tr.detach().size()==0");
    local_3801 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3800);
    local_3801 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_2f68);
  mydata::~mydata((mydata *)0x120cf8);
  cppcms::triggers_recorder::~triggers_recorder(local_2f38);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_3848,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_3878);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3898,"foo",&local_3899);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_3898,SUB81(local_3878,0));
  std::__cxx11::string::~string(local_3898);
  std::allocator<char>::~allocator((allocator<char> *)&local_3899);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_3a18);
    poVar3 = std::operator<<((ostream *)local_3a18,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xfe);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp)");
    local_3a39 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3a38);
    local_3a39 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a60,"dat",&local_3a61);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_3a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a61);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3be0);
    poVar3 = std::operator<<((ostream *)local_3be0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xff);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d)");
    local_3c01 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3c00);
    local_3c01 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_3850 != 1) || (local_384c != 2)) {
    std::__cxx11::ostringstream::ostringstream(local_3d80);
    poVar3 = std::operator<<((ostream *)local_3d80,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x100);
    std::operator<<(poVar3," d.x==1 && d.y==2");
    local_3da1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3da0);
    local_3da1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3f20);
    poVar3 = std::operator<<((ostream *)local_3f20,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x101);
    std::operator<<(poVar3," tmp==\"bar\"");
    local_3f41 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3f40);
    local_3f41 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12160e);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x121623);
  if (sVar6 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_40f0);
    poVar3 = std::operator<<((ostream *)local_40f0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x102);
    std::operator<<(poVar3," tr.detach().size()==2");
    local_4111 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_4110);
    local_4111 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_3878);
  mydata::~mydata((mydata *)0x1217d5);
  cppcms::triggers_recorder::~triggers_recorder(local_3848);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_4158,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4188,"foo",&local_4189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_41b0,"baz",&local_41b1);
  cppcms::cache_interface::store_frame(psVar5,local_4188,(int)local_41b0,true);
  std::__cxx11::string::~string(local_41b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_41b1);
  std::__cxx11::string::~string(local_4188);
  std::allocator<char>::~allocator((allocator<char> *)&local_4189);
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_41d8,"dat",&local_41d9);
  cppcms::cache_interface::store_data<mydata>
            (in_stack_ffffffffffff9070,in_stack_ffffffffffff9068,
             (mydata *)
             CONCAT17(in_stack_ffffffffffff9067,
                      CONCAT16(in_stack_ffffffffffff9066,in_stack_ffffffffffff9060)),
             (int)((ulong)in_stack_ffffffffffff9058 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffff9058 >> 0x18,0));
  std::__cxx11::string::~string(local_41d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_41d9);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1219ba);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1219cf);
  if (sVar6 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_4388);
    poVar3 = std::operator<<((ostream *)local_4388,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10a);
    std::operator<<(poVar3," tr.detach().size()==0");
    local_43a9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_43a8);
    local_43a9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  mydata::~mydata((mydata *)0x121c98);
  cppcms::triggers_recorder::~triggers_recorder(local_4158);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar4 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(local_43f0,pcVar4);
  mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                 (int)in_stack_ffffffffffff8ff8);
  std::__cxx11::string::string(local_4420);
  psVar5 = (string *)cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4440,"foo",&local_4441);
  bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_4440,SUB81(local_4420,0));
  std::__cxx11::string::~string(local_4440);
  std::allocator<char>::~allocator((allocator<char> *)&local_4441);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_45c0);
    poVar3 = std::operator<<((ostream *)local_45c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x111);
    std::operator<<(poVar3," cache().fetch_frame(\"foo\",tmp,true)");
    local_45e1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_45e0);
    local_45e1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::cache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4608,"dat",&local_4609);
  bVar2 = cppcms::cache_interface::fetch_data<mydata>
                    (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048,
                     SUB81((ulong)in_stack_ffffffffffff9040 >> 0x38,0));
  std::__cxx11::string::~string(local_4608);
  std::allocator<char>::~allocator((allocator<char> *)&local_4609);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_4788);
    poVar3 = std::operator<<((ostream *)local_4788,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x112);
    std::operator<<(poVar3," cache().fetch_data(\"dat\",d,true)");
    local_47a9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_47a8);
    local_47a9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_43f8 == 4) && (local_43f4 == 5)) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_4ac8);
      poVar3 = std::operator<<((ostream *)local_4ac8,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x114);
      std::operator<<(poVar3," tmp==\"baz\"");
      local_4ae9 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_4ae8);
      local_4ae9 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::triggers_recorder::detach_abi_cxx11_();
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1225a7);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1225bc);
    if (sVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_4c98);
      poVar3 = std::operator<<((ostream *)local_4c98,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x115);
      std::operator<<(poVar3," tr.detach().size()==0");
      local_4cb9 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_4cb8);
      local_4cb9 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string(local_4420);
    mydata::~mydata((mydata *)0x12276e);
    cppcms::triggers_recorder::~triggers_recorder(local_43f0);
    cppcms::application::cache();
    cppcms::cache_interface::clear();
    poVar3 = std::operator<<((ostream *)&std::cout,"-- Timeouts");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                   (int)in_stack_ffffffffffff8ff8);
    mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                   (int)in_stack_ffffffffffff8ff8);
    psVar5 = (string *)cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d00,"foo1",&local_4d01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d28,"baz1",&local_4d29);
    local_4d48 = 0;
    uStack_4d40 = 0;
    local_4d58 = 0;
    uStack_4d50 = 0;
    local_4d68 = 0;
    uStack_4d60 = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1228a4);
    cppcms::cache_interface::store_frame(psVar5,local_4d00,(set *)local_4d28,(int)&local_4d68,true);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1228e4);
    std::__cxx11::string::~string(local_4d28);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d29);
    std::__cxx11::string::~string(local_4d00);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d01);
    cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d88,"dat1",&local_4d89);
    local_4da8 = 0;
    uStack_4da0 = 0;
    local_4db8 = 0;
    uStack_4db0 = 0;
    local_4dc8 = 0;
    uStack_4dc0 = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x122992);
    cppcms::cache_interface::store_data<mydata>
              ((cache_interface *)in_stack_ffffffffffff9050,(string *)in_stack_ffffffffffff9048,
               in_stack_ffffffffffff9040,in_stack_ffffffffffff9038,
               (int)((ulong)in_stack_ffffffffffff9030 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffff9030 >> 0x18,0));
    uVar10 = (undefined1)((ulong)in_stack_ffffffffffff9040 >> 0x38);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1229d2);
    std::__cxx11::string::~string(local_4d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d89);
    psVar5 = (string *)cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4de8,"foo2",&local_4de9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e10,"baz2",&local_4e11);
    cppcms::cache_interface::store_frame(psVar5,local_4de8,(int)local_4e10,true);
    std::__cxx11::string::~string(local_4e10);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e11);
    std::__cxx11::string::~string(local_4de8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4de9);
    cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e38,"dat2",&local_4e39);
    cppcms::cache_interface::store_data<mydata>
              (in_stack_ffffffffffff9070,in_stack_ffffffffffff9068,
               (mydata *)
               CONCAT17(in_stack_ffffffffffff9067,
                        CONCAT16(in_stack_ffffffffffff9066,in_stack_ffffffffffff9060)),
               (int)((ulong)in_stack_ffffffffffff9058 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffff9058 >> 0x18,0));
    std::__cxx11::string::~string(local_4e38);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e39);
    mydata::~mydata((mydata *)0x122b62);
    mydata::~mydata((mydata *)0x122b6f);
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                   (int)in_stack_ffffffffffff8ff8);
    mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                   (int)in_stack_ffffffffffff8ff8);
    std::__cxx11::string::string(local_4e80);
    std::__cxx11::string::string(local_4ea0);
    psVar5 = (string *)cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4ec0,"foo1",&local_4ec1);
    bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_4ec0,SUB81(local_4e80,0));
    std::__cxx11::string::~string(local_4ec0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4ec1);
    if ((bVar1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_5040);
      poVar3 = std::operator<<((ostream *)local_5040,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x128);
      std::operator<<(poVar3," cache().fetch_frame(\"foo1\",t1,true)");
      local_5061 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_5060);
      local_5061 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar5 = (string *)cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5088,"foo2",&local_5089);
    bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_5088,SUB81(local_4ea0,0));
    std::__cxx11::string::~string(local_5088);
    std::allocator<char>::~allocator((allocator<char> *)&local_5089);
    if ((bVar1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_5208);
      poVar3 = std::operator<<((ostream *)local_5208,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x129);
      std::operator<<(poVar3," cache().fetch_frame(\"foo2\",t2,true)");
      local_5229 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_5228);
      local_5229 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5250,"dat1",&local_5251);
    bVar2 = cppcms::cache_interface::fetch_data<mydata>
                      (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048
                       ,(bool)uVar10);
    std::__cxx11::string::~string(local_5250);
    std::allocator<char>::~allocator((allocator<char> *)&local_5251);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_53d0);
      poVar3 = std::operator<<((ostream *)local_53d0,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12a);
      std::operator<<(poVar3," cache().fetch_data(\"dat1\",d1,true)");
      local_53f1 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_53f0);
      local_53f1 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5418,"dat2",&local_5419);
    bVar2 = cppcms::cache_interface::fetch_data<mydata>
                      (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,in_stack_ffffffffffff9048
                       ,(bool)uVar10);
    std::__cxx11::string::~string(local_5418);
    std::allocator<char>::~allocator((allocator<char> *)&local_5419);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_5598);
      poVar3 = std::operator<<((ostream *)local_5598,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,299);
      std::operator<<(poVar3," cache().fetch_data(\"dat2\",d2,true)");
      local_55b9 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_55b8);
      local_55b9 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_4e48 != 1) || (local_4e44 != 2)) {
      std::__cxx11::ostringstream::ostringstream(local_5738);
      poVar3 = std::operator<<((ostream *)local_5738,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,300);
      std::operator<<(poVar3," d1.x==1 && d1.y==2");
      local_5759 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_5758);
      local_5759 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_4e58 == 4) && (local_4e54 == 5)) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_5a78);
        poVar3 = std::operator<<((ostream *)local_5a78,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12e);
        std::operator<<(poVar3," t1==\"baz1\"");
        local_5a99 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_5a98);
        local_5a99 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_5c18);
        poVar3 = std::operator<<((ostream *)local_5c18,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12f);
        std::operator<<(poVar3," t2==\"baz2\"");
        local_5c39 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_5c38);
        local_5c39 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string(local_4ea0);
      std::__cxx11::string::~string(local_4e80);
      mydata::~mydata((mydata *)0x123eab);
      mydata::~mydata((mydata *)0x123eb8);
      booster::ptime::millisleep((longlong)in_stack_ffffffffffff9010);
      cppcms::application::cache();
      cppcms::cache_interface::reset();
      mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                     (int)in_stack_ffffffffffff8ff8);
      mydata::mydata(in_stack_ffffffffffff9000,(int)((ulong)in_stack_ffffffffffff8ff8 >> 0x20),
                     (int)in_stack_ffffffffffff8ff8);
      std::__cxx11::string::string(local_5c80);
      std::__cxx11::string::string(local_5ca0);
      psVar5 = (string *)cppcms::application::cache();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5cc0,"foo1",&local_5cc1);
      bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_5cc0,SUB81(local_5c80,0));
      std::__cxx11::string::~string(local_5cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5cc1);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_5e40);
        poVar3 = std::operator<<((ostream *)local_5e40,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x136);
        std::operator<<(poVar3," !cache().fetch_frame(\"foo1\",t1,true)");
        local_5e61 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_5e60);
        local_5e61 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      psVar5 = (string *)cppcms::application::cache();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e88,"foo2",&local_5e89);
      bVar1 = cppcms::cache_interface::fetch_frame(psVar5,local_5e88,SUB81(local_5ca0,0));
      std::__cxx11::string::~string(local_5e88);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e89);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_6008);
        poVar3 = std::operator<<((ostream *)local_6008,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x137);
        std::operator<<(poVar3," !cache().fetch_frame(\"foo2\",t2,true)");
        local_6029 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_6028);
        local_6029 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::application::cache();
      paVar9 = &local_6051;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6050,"dat1",paVar9);
      bVar2 = cppcms::cache_interface::fetch_data<mydata>
                        (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,
                         in_stack_ffffffffffff9048,(bool)uVar10);
      bVar1 = bVar2 ^ 0xff;
      std::__cxx11::string::~string(local_6050);
      std::allocator<char>::~allocator((allocator<char> *)&local_6051);
      if ((bVar1 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_61d0);
        poVar3 = std::operator<<((ostream *)local_61d0,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x138);
        std::operator<<(poVar3," !cache().fetch_data(\"dat1\",d1,true)");
        local_61f1 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_61f0);
        local_61f1 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::application::cache();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6218,"dat2",&local_6219);
      bVar2 = cppcms::cache_interface::fetch_data<mydata>
                        (in_stack_ffffffffffff9058,in_stack_ffffffffffff9050,
                         in_stack_ffffffffffff9048,(bool)uVar10);
      bVar1 = bVar2 ^ 0xff;
      std::__cxx11::string::~string(local_6218);
      std::allocator<char>::~allocator((allocator<char> *)&local_6219);
      if ((bVar1 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_6398);
        poVar3 = std::operator<<((ostream *)local_6398,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x139);
        std::operator<<(poVar3," !cache().fetch_data(\"dat2\",d2,true)");
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_63b8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string(local_5ca0);
      std::__cxx11::string::~string(local_5c80);
      mydata::~mydata((mydata *)0x124939);
      mydata::~mydata((mydata *)0x124946);
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_58d8);
    poVar3 = std::operator<<((ostream *)local_58d8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12d);
    std::operator<<(poVar3," d2.x==4 && d2.y==5");
    local_58f9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_58f8);
    local_58f9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_4928);
  poVar3 = std::operator<<((ostream *)local_4928,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x113);
  std::operator<<(poVar3," d.x==4 && d.y==5");
  local_4949 = 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar7,local_4948);
  local_4949 = 0;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_objects()
	{
		std::cout << "- Data Object" << std::endl;
		set_context(false);

		{
			std::cout << "-- With Triggers Full API" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				std::set<std::string> t1,t2;
				t1.insert("k1");
				t2.insert("k2");
				cache().store_frame("foo","bar",t1);
				cache().store_data("dat",d,t2);
				TEST(tr.detach().size()==4);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==4);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
				TEST(tg.count("k1")==1);
				TEST(tg.count("k2")==1);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1);
				cache().store_data("dat",d,-1);
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==2);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
			}
		}
		cache().clear();
		{
			std::cout << "-- Without Triggers" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				cache().store_frame("foo","bar",std::set<std::string>(),-1,true);
				cache().store_data("dat",d,std::set<std::string>(),-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1,true);
				cache().store_data("dat",d,-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				TEST(tr.detach().size()==0);
			}
		}
		cache().clear();
		{
			std::cout << "-- Timeouts" << std::endl;
			{
				cache().reset();
				mydata d1(1,2);
				mydata d2(4,5);
				cache().store_frame("foo1","baz1",std::set<std::string>(),2,true);
				cache().store_data("dat1",d1,std::set<std::string>(),2,true);
				cache().store_frame("foo2","baz2",2,true);
				cache().store_data("dat2",d2,2,true);
			}
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(cache().fetch_frame("foo1",t1,true));
				TEST(cache().fetch_frame("foo2",t2,true));
				TEST(cache().fetch_data("dat1",d1,true));
				TEST(cache().fetch_data("dat2",d2,true));
				TEST(d1.x==1  && d1.y==2);
				TEST(d2.x==4  && d2.y==5);
				TEST(t1=="baz1");
				TEST(t2=="baz2");
			}
			booster::ptime::millisleep(3000);
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(!cache().fetch_frame("foo1",t1,true));
				TEST(!cache().fetch_frame("foo2",t2,true));
				TEST(!cache().fetch_data("dat1",d1,true));
				TEST(!cache().fetch_data("dat2",d2,true));
			}
		}


	}